

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O0

void __thiscall DSK::SetInfoDirEntry(DSK *this,int NumDir,StDirEntry *Dir)

{
  uchar *puVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int local_30;
  int local_2c;
  int i;
  int t;
  int s;
  int MinSect;
  StDirEntry *Dir_local;
  int NumDir_local;
  DSK *this_local;
  
  iVar9 = GetMinSect(this);
  local_2c = 0;
  if (iVar9 == 0x41) {
    local_2c = 2;
  }
  if (iVar9 == 1) {
    local_2c = 1;
  }
  for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
    iVar10 = GetPosData(this,local_2c,(NumDir >> 4) + iVar9,true);
    lVar11 = (long)(int)((NumDir & 0xfU) * 0x20 + iVar10);
    cVar2 = Dir->Nom[0];
    cVar3 = Dir->Nom[1];
    cVar4 = Dir->Nom[2];
    cVar5 = Dir->Nom[3];
    cVar6 = Dir->Nom[4];
    cVar7 = Dir->Nom[5];
    cVar8 = Dir->Nom[6];
    puVar1 = this->ImgDsk + lVar11;
    puVar1[0] = Dir->User;
    puVar1[1] = cVar2;
    puVar1[2] = cVar3;
    puVar1[3] = cVar4;
    puVar1[4] = cVar5;
    puVar1[5] = cVar6;
    puVar1[6] = cVar7;
    puVar1[7] = cVar8;
    *(undefined8 *)(this->ImgDsk + lVar11 + 8) = *(undefined8 *)(Dir->Nom + 7);
    *(undefined8 *)(this->ImgDsk + lVar11 + 0x10) = *(undefined8 *)Dir->Blocks;
    *(undefined8 *)(this->ImgDsk + lVar11 + 0x18) = *(undefined8 *)(Dir->Blocks + 8);
  }
  return;
}

Assistant:

void DSK::SetInfoDirEntry( int NumDir, StDirEntry * Dir ) {
    int MinSect = GetMinSect();
    int s = ( NumDir >> 4 ) + MinSect;
    int t = ( MinSect == 0x41 ? 2 : 0 );
    if ( MinSect == 1 )
        t = 1;
	
    for (int i =0; i<16; i++) 
		memcpy( &ImgDsk[ ( ( NumDir & 15 ) << 5 ) + GetPosData( t, s, true ) ]
				, Dir
				, sizeof( StDirEntry )
				);
}